

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_gcc.cc
# Opt level: O1

void ARGBMirrorRow_AVX2(uint8_t *src,uint8_t *dst,int width)

{
  bool bVar1;
  undefined1 auVar2 [32];
  ulvec32 auVar3;
  long lVar4;
  long lVar5;
  
  auVar3 = libyuv::kARGBShuffleMirror_AVX2;
  lVar4 = (long)width;
  do {
    auVar2 = vpermd_avx2((undefined1  [32])auVar3,*(undefined1 (*) [32])(src + lVar4 * 4 + -0x20));
    *(undefined1 (*) [32])dst = auVar2;
    dst = (uint8_t *)((long)dst + 0x20);
    lVar5 = lVar4 + -8;
    bVar1 = 7 < lVar4;
    lVar4 = lVar5;
  } while (lVar5 != 0 && bVar1);
  return;
}

Assistant:

void ARGBMirrorRow_AVX2(const uint8_t* src, uint8_t* dst, int width) {
  intptr_t temp_width = (intptr_t)(width);
  asm volatile(

      "vmovdqu     %3,%%ymm5                     \n"

      LABELALIGN
      "1:                                        \n"
      "vpermd      -0x20(%0,%2,4),%%ymm5,%%ymm0  \n"
      "vmovdqu     %%ymm0,(%1)                   \n"
      "lea         0x20(%1),%1                   \n"
      "sub         $0x8,%2                       \n"
      "jg          1b                            \n"
      "vzeroupper                                \n"
      : "+r"(src),                    // %0
        "+r"(dst),                    // %1
        "+r"(temp_width)              // %2
      : "m"(kARGBShuffleMirror_AVX2)  // %3
      : "memory", "cc", "xmm0", "xmm5");
}